

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void detect_skipped_tests(pcut_item_t *first)

{
  pcut_extra_t local_20;
  pcut_extra_t *extras;
  pcut_item_t *it;
  pcut_item_t *first_local;
  
  if (first == (pcut_item_t *)0x0) {
    __assert_fail("first != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vhotspur[P]pcut/src/list.c"
                  ,0x8b,"void detect_skipped_tests(pcut_item_t *)");
  }
  it = first;
  if (first->kind == 0) {
    it = pcut_get_real_next(first);
  }
  extras = (pcut_extra_t *)it;
  do {
    if (extras == (pcut_extra_t *)0x0) {
      return;
    }
    if (extras[2].timeout == 5) {
      for (local_20 = extras[7]; *(int *)local_20 != 2;
          local_20 = (pcut_extra_t)((long)local_20 + 8)) {
        if (*(int *)local_20 == 1) {
          extras[2].timeout = 0;
          break;
        }
      }
    }
    extras = (pcut_extra_t *)pcut_get_real_next((pcut_item_t *)extras);
  } while( true );
}

Assistant:

static void detect_skipped_tests(pcut_item_t *first) {
	pcut_item_t *it;

	assert(first != NULL);
	if (first->kind == PCUT_KIND_SKIP) {
		first = pcut_get_real_next(first);
	}

	for (it = first; it != NULL; it = pcut_get_real_next(it)) {
		pcut_extra_t *extras;

		if (it->kind != PCUT_KIND_TEST) {
			continue;
		}

		extras = it->extras;
		while (extras->type != PCUT_EXTRA_LAST) {
			if (extras->type == PCUT_EXTRA_SKIP) {
				it->kind = PCUT_KIND_SKIP;
				break;
			}
			extras++;
		}
	}
}